

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::web_peer_connection::received_invalid_data
          (web_peer_connection *this,piece_index_t index,bool single_peer)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  torrent_info *this_01;
  file_storage *this_02;
  size_type sVar3;
  reference pvVar4;
  __tuple_element_t<0UL,_tuple<strong_typedef<int,_piece_index_tag,_void>,_strong_typedef<int,_piece_index_tag,_void>_>_>
  *p_Var5;
  __tuple_element_t<1UL,_tuple<strong_typedef<int,_piece_index_tag,_void>,_strong_typedef<int,_piece_index_tag,_void>_>_>
  *rhs;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_90;
  int local_8c;
  piece_index_t i;
  tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  range;
  undefined1 local_78 [8];
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> files;
  file_storage *fs;
  undefined1 local_30 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  bool single_peer_local;
  web_peer_connection *this_local;
  piece_index_t index_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = single_peer;
  if (single_peer) {
    peer_connection::associated_torrent((peer_connection *)&fs);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_30);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr((weak_ptr<libtorrent::aux::torrent> *)&fs);
    this_00 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
    this_01 = torrent::torrent_file(this_00);
    this_02 = torrent_info::files(this_01);
    iVar2 = file_storage::num_files(this_02);
    if (iVar2 == 1) {
      this_local._7_1_ =
           peer_connection::received_invalid_data
                     ((peer_connection *)this,index,
                      (bool)(t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi._7_1_ & 1));
      files.super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      iVar2 = file_storage::piece_size(this_02,index);
      file_storage::map_block
                ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)local_78
                 ,this_02,index,0,(long)iVar2);
      sVar3 = ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::size
                        ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)
                         local_78);
      if (sVar3 == 1) {
        pvVar4 = ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::
                 operator[]((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                             *)local_78,0);
        local_8c = (pvVar4->file_index).m_val;
        file_piece_range_inclusive((aux *)&i,this_02,(file_index_t)local_8c);
        p_Var5 = ::std::
                 get<0ul,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                           ((tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                             *)&i);
        local_90.m_val = p_Var5->m_val;
        while( true ) {
          rhs = ::std::
                get<1ul,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                          ((tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                            *)&i);
          bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator!=
                            (&local_90,rhs);
          if (!bVar1) break;
          peer_connection::incoming_dont_have((peer_connection *)this,(piece_index_t)local_90.m_val)
          ;
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_90);
        }
      }
      else {
        peer_connection::incoming_dont_have((peer_connection *)this,index);
      }
      peer_connection::received_invalid_data
                ((peer_connection *)this,index,
                 (bool)(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._7_1_ & 1));
      iVar2 = peer_connection::num_have_pieces((peer_connection *)this);
      this_local._7_1_ = iVar2 == 0;
      files.super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::~vector
                ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)local_78
                );
    }
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_30);
  }
  else {
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = index.m_val;
    this_local._7_1_ =
         peer_connection::received_invalid_data((peer_connection *)this,index,single_peer);
  }
  return this_local._7_1_;
}

Assistant:

bool web_peer_connection::received_invalid_data(piece_index_t const index, bool single_peer)
{
	if (!single_peer) return peer_connection::received_invalid_data(index, single_peer);

	// when a web seed fails a hash check, do the following:
	// 1. if the whole piece only overlaps a single file, mark that file as not
	//    have for this peer
	// 2. if the piece overlaps more than one file, mark the piece as not have
	//    for this peer
	// 3. if it's a single file torrent, just ban it right away
	// this handles the case where web seeds may have some files updated but not other

	auto t = associated_torrent().lock();
	file_storage const& fs = t->torrent_file().files();

	// single file torrent
	if (fs.num_files() == 1) return peer_connection::received_invalid_data(index, single_peer);

	std::vector<file_slice> files = fs.map_block(index, 0, fs.piece_size(index));

	if (files.size() == 1)
	{
		// assume the web seed has a different copy of this specific file
		// than what we expect, and pretend not to have it.
		auto const range = file_piece_range_inclusive(fs, files[0].file_index);
		for (piece_index_t i = std::get<0>(range); i != std::get<1>(range); ++i)
			incoming_dont_have(i);
	}
	else
	{
		incoming_dont_have(index);
	}

	peer_connection::received_invalid_data(index, single_peer);

	// if we don't think we have any of the files, allow banning the web seed
	if (num_have_pieces() == 0) return true;

	// don't disconnect, we won't request anything from this file again
	return false;
}